

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseLinearSpectrum *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  SpectrumHandle *in_RDX;
  size_t i;
  ulong uVar1;
  long lVar2;
  float *in_R8;
  string ret;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_78 = (ulong)this | 0x3000000000000;
  FindMatchingNamedSpectrum_abi_cxx11_(&local_70,(pbrt *)&local_78,in_RDX);
  if (local_70._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"[ PiecewiseLinearSpectrum ",(allocator<char> *)&local_50);
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < (this->lambdas).nStored; uVar1 = uVar1 + 1) {
      StringPrintf<float_const&,float_const&>
                (&local_50,(pbrt *)"%f %f ",(char *)((long)(this->lambdas).ptr + lVar2),
                 (float *)((long)(this->values).ptr + lVar2),in_R8);
      std::__cxx11::string::append((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_50);
      lVar2 = lVar2 + 4;
    }
    std::operator+(__return_storage_ptr__,&local_98," ]");
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    StringPrintf<std::__cxx11::string&>
              (__return_storage_ptr__,(pbrt *)0x438615,(char *)&local_70,in_RCX);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string PiecewiseLinearSpectrum::ToString() const {
    std::string name = FindMatchingNamedSpectrum(this);
    if (!name.empty())
        return StringPrintf("\"%s\"", name);

    std::string ret = "[ PiecewiseLinearSpectrum ";
    for (size_t i = 0; i < lambdas.size(); ++i)
        ret += StringPrintf("%f %f ", lambdas[i], values[i]);
    return ret + " ]";
}